

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int uv_fs_event_stop(uv_fs_event_t *handle)

{
  watcher_list *w_00;
  watcher_list *w;
  uv_fs_event_t *handle_local;
  
  if ((handle->flags & 4) != 0) {
    w_00 = find_watcher(handle->loop,handle->wd);
    if (w_00 == (watcher_list *)0x0) {
      __assert_fail("w != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                    ,0xa21,"int uv_fs_event_stop(uv_fs_event_t *)");
    }
    handle->wd = -1;
    handle->path = (char *)0x0;
    if (((handle->flags & 4) != 0) &&
       (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
      handle->loop->active_handles = handle->loop->active_handles - 1;
    }
    uv__queue_remove(&handle->watchers);
    maybe_free_watcher_list(w_00,handle->loop);
  }
  return 0;
}

Assistant:

int uv_fs_event_stop(uv_fs_event_t* handle) {
  struct watcher_list* w;

  if (!uv__is_active(handle))
    return 0;

  w = find_watcher(handle->loop, handle->wd);
  assert(w != NULL);

  handle->wd = -1;
  handle->path = NULL;
  uv__handle_stop(handle);
  uv__queue_remove(&handle->watchers);

  maybe_free_watcher_list(w, handle->loop);

  return 0;
}